

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O2

void __thiscall o3dgc::Vector<long>::Allocate(Vector<long> *this,unsigned_long size)

{
  long *__src;
  long *__dest;
  
  if (this->m_allocated < size) {
    this->m_allocated = size;
    __dest = (long *)operator_new__(-(ulong)(size >> 0x3d != 0) | size << 3);
    if (this->m_size != 0) {
      __src = this->m_buffer;
      memcpy(__dest,__src,this->m_size << 3);
      if (__src != (long *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_buffer = __dest;
  }
  return;
}

Assistant:

void                    Allocate(unsigned long size)
                                {
                                    if (size > m_allocated)
                                    {
                                        m_allocated = size;
                                        T * tmp     = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                }